

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

void __thiscall wasm::RefEq::finalize(RefEq *this)

{
  uintptr_t uVar1;
  
  if ((this->left->type).id == 1) {
    uVar1 = 1;
  }
  else {
    uVar1 = (ulong)((this->right->type).id != 1) + 1;
  }
  (this->super_SpecificExpression<(wasm::Expression::Id)44>).super_Expression.type.id = uVar1;
  return;
}

Assistant:

void RefEq::finalize() {
  if (left->type == Type::unreachable || right->type == Type::unreachable) {
    type = Type::unreachable;
  } else {
    type = Type::i32;
  }
}